

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void list_saves(void)

{
  _Bool _Var1;
  savefile_details *psVar2;
  savefile_getter g;
  savefile_getter local_20;
  
  local_20 = (savefile_getter)0x0;
  _Var1 = got_savefile(&local_20);
  if (_Var1) {
    puts("Savefiles you can use are:");
    do {
      psVar2 = get_savefile_details(local_20);
      if (psVar2->desc == (char *)0x0) {
        printf(" %-15s\n",psVar2->fnam + psVar2->foff);
      }
      else {
        printf(" %-15s  %s\n",psVar2->fnam + psVar2->foff);
      }
      _Var1 = got_savefile(&local_20);
    } while (_Var1);
    puts("\nUse angband -u<name> to use savefile <name>.");
    cleanup_savefile_getter(local_20);
  }
  else {
    _Var1 = got_savefile_dir(local_20);
    cleanup_savefile_getter(local_20);
    if (!_Var1) {
      quit_fmt("Cannot open savefile directory");
    }
    puts("There are no savefiles you can use.");
  }
  return;
}

Assistant:

static void list_saves(void)
{
	savefile_getter g = NULL;

	if (!got_savefile(&g)) {
		bool nodir = !got_savefile_dir(g);

		cleanup_savefile_getter(g);
		if (nodir) {
			quit_fmt("Cannot open savefile directory");
		}
		printf("There are no savefiles you can use.\n");
		return;
	}

	printf("Savefiles you can use are:\n");
	do {
		const struct savefile_details *details =
			get_savefile_details(g);

		if (details->desc) {
			printf(" %-15s  %s\n", details->fnam + details->foff,
				details->desc);
		} else {
			printf(" %-15s\n", details->fnam + details->foff);
		}
	} while (got_savefile(&g));
	printf("\nUse angband -u<name> to use savefile <name>.\n");

	cleanup_savefile_getter(g);
}